

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Material.hpp
# Opt level: O1

string * __thiscall
njoy::ENDFtk::tree::Material::content_abi_cxx11_(string *__return_storage_ptr__,Material *this)

{
  _Base_ptr p_Var1;
  _Rb_tree_header *p_Var2;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  output;
  undefined1 local_78 [32];
  _Head_base<1UL,_double,_false> _Stack_58;
  undefined4 uStack_50;
  undefined4 local_4c;
  int iStack_48;
  int aiStack_44 [3];
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  p_Var1 = (this->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(this->files_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var1 != p_Var2) {
    do {
      File::content_abi_cxx11_((string *)local_78,(File *)&p_Var1[1]._M_parent);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_78._0_8_);
      if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
        operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
      }
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
    } while ((_Rb_tree_header *)p_Var1 != p_Var2);
  }
  if (__return_storage_ptr__->_M_string_length != 0) {
    iStack_48 = 0;
    aiStack_44[0] = 0;
    aiStack_44[1] = 0;
    _Stack_58._M_head_impl = 0.0;
    uStack_50 = 0;
    local_4c = 0;
    local_78._16_8_ = 0;
    local_78._24_8_ = 0;
    local_78._0_8_ = (pointer)0x0;
    local_78._8_8_ = 0;
    local_38.container = __return_storage_ptr__;
    StructureDivision::print<std::back_insert_iterator<std::__cxx11::string>>
              ((StructureDivision *)local_78,&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

auto content() const {

      std::string content;
      for ( const auto& file : this->files() ) {

        content += file.content();
      }

      if ( content.size() ) {

        auto output = std::back_inserter( content );
        MEND().print( output );
      }

      return content;
    }